

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O2

void trial::protocol::serialization::
     load_overloader<trial::protocol::bintoken::iarchive,_std::array<bool,_4UL>,_void>::load
               (iarchive *ar,array<bool,_4UL> *data,uint protocol_version)

{
  error *this;
  size_t i;
  long lVar1;
  bool value;
  size_t count;
  
  bintoken::iarchive::load<trial::protocol::bintoken::token::begin_array>(ar);
  bintoken::iarchive::load<unsigned_long>(ar,&count);
  if (count == 4) {
    for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
      bintoken::iarchive::load<bool>(ar,&value);
      data->_M_elems[lVar1] = value;
    }
    if ((ar->reader).decoder.current.code == end_array) {
      bintoken::iarchive::load<trial::protocol::bintoken::token::end_array>(ar);
      return;
    }
    this = (error *)__cxa_allocate_exception(0x20);
    bintoken::error::error(this,expected_end_array);
  }
  else {
    this = (error *)__cxa_allocate_exception(0x20);
    bintoken::error::error(this,incompatible_type);
  }
  __cxa_throw(this,&bintoken::error::typeinfo,std::system_error::~system_error);
}

Assistant:

static void load(protocol::bintoken::iarchive& ar,
                     std::array<T, N>& data,
                     const unsigned int protocol_version)
    {
        ar.load<bintoken::token::begin_array>();

        std::size_t count;
        ar.load_override(count, protocol_version);
        if (count != N)
            throw bintoken::error(bintoken::incompatible_type);

        for (std::size_t i = 0; i < N; ++i)
        {
            T value;
            ar >> value;
            data[i] = value;
        }
        if (!ar.at<bintoken::token::end_array>())
            throw bintoken::error(bintoken::expected_end_array);
        ar.load<bintoken::token::end_array>();
    }